

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O3

void __thiscall embree::XML::XML(XML *this,string *name)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__XML_002c8108;
  (this->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  *(undefined4 *)&(this->loc).lineNumber = 0xffffffff;
  *(undefined4 *)((long)&(this->loc).lineNumber + 4) = 0xffffffff;
  *(undefined4 *)&(this->loc).colNumber = 0xffffffff;
  *(undefined4 *)((long)&(this->loc).colNumber + 4) = 0xffffffff;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar2,pcVar2 + name->_M_string_length);
  p_Var1 = &(this->parms)._M_t._M_impl.super__Rb_tree_header;
  (this->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined1 (*) [16])&(this->parms)._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  (this->children).
  super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

XML (const std::string& name = "") : name(name) {}